

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void free_SNode(Parser *p,SNode *s)

{
  uint32 *puVar1;
  ZNode *z;
  ZNode **__ptr;
  PNode *pn;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (s->zns).n;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      z = (s->zns).v[uVar3];
      if (z != (ZNode *)0x0) {
        free_ZNode(p,z,s);
        uVar2 = (s->zns).n;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  __ptr = (s->zns).v;
  if (__ptr != (s->zns).e && __ptr != (ZNode **)0x0) {
    free(__ptr);
  }
  (s->zns).n = 0;
  (s->zns).v = (ZNode **)0x0;
  pn = s->last_pn;
  if (pn != (PNode *)0x0) {
    puVar1 = &pn->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pn);
    }
  }
  free(s);
  return;
}

Assistant:

static void free_SNode(Parser *p, struct SNode *s) {
  uint i;
  for (i = 0; i < s->zns.n; i++)
    if (s->zns.v[i]) free_ZNode(p, s->zns.v[i], s);
  vec_free(&s->zns);
  if (s->last_pn) unref_pn(p, s->last_pn);
#ifdef USE_FREELISTS
  s->all_next = p->free_snodes;
  p->free_snodes = s;
#else
  FREE(s);
#endif
}